

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O0

bool __thiscall OpenMD::RigidBody::getAtomVel(RigidBody *this,Vector3d *vel,uint index)

{
  double dVar1;
  double dVar2;
  size_type sVar3;
  double *pdVar4;
  SquareMatrix3<double> *m1;
  RectMatrix<double,_3U,_3U> *m;
  Vector<double,_3U> *v;
  Vector<double,_3U> *v_00;
  uint in_EDX;
  long *in_RDI;
  SquareMatrix3<double> *m2;
  StuntDouble *this_00;
  Mat3x3d I;
  Vector3d ji;
  Vector3d ref;
  Mat3x3d skewMat;
  Vector3d velRot;
  undefined4 in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcbc;
  Vector3<double> *in_stack_fffffffffffffcc0;
  StuntDouble *in_stack_fffffffffffffcc8;
  RectMatrix<double,_3U,_3U> local_108;
  Vector<double,_3U> local_c0 [2];
  RectMatrix<double,_3U,_3U> local_80;
  uint local_1c;
  byte local_1;
  
  local_1c = in_EDX;
  sVar3 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::size
                    ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x25));
  if (in_EDX < sVar3) {
    Vector3<double>::Vector3((Vector3<double> *)0x33210a);
    SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x332117);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               (in_RDI + 0x2b),(ulong)local_1c);
    Vector3<double>::Vector3
              (in_stack_fffffffffffffcc0,
               (Vector3<double> *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
    StuntDouble::getJ(in_stack_fffffffffffffcc8);
    (**(code **)(*in_RDI + 0x28))(&local_108);
    pdVar4 = RectMatrix<double,_3U,_3U>::operator()(&local_80,0,0);
    *pdVar4 = 0.0;
    pdVar4 = Vector<double,_3U>::operator[](local_c0,2);
    dVar1 = *pdVar4;
    pdVar4 = RectMatrix<double,_3U,_3U>::operator()(&local_108,2,2);
    dVar2 = *pdVar4;
    pdVar4 = RectMatrix<double,_3U,_3U>::operator()(&local_80,0,1);
    *pdVar4 = dVar1 / dVar2;
    pdVar4 = Vector<double,_3U>::operator[](local_c0,1);
    dVar1 = *pdVar4;
    pdVar4 = RectMatrix<double,_3U,_3U>::operator()(&local_108,1,1);
    dVar2 = *pdVar4;
    pdVar4 = RectMatrix<double,_3U,_3U>::operator()(&local_80,0,2);
    *pdVar4 = -dVar1 / dVar2;
    pdVar4 = Vector<double,_3U>::operator[](local_c0,2);
    dVar1 = *pdVar4;
    pdVar4 = RectMatrix<double,_3U,_3U>::operator()(&local_108,2,2);
    dVar2 = *pdVar4;
    pdVar4 = RectMatrix<double,_3U,_3U>::operator()(&local_80,1,0);
    *pdVar4 = -dVar1 / dVar2;
    pdVar4 = RectMatrix<double,_3U,_3U>::operator()(&local_80,1,1);
    *pdVar4 = 0.0;
    pdVar4 = Vector<double,_3U>::operator[](local_c0,0);
    dVar1 = *pdVar4;
    pdVar4 = RectMatrix<double,_3U,_3U>::operator()(&local_108,0,0);
    dVar2 = *pdVar4;
    pdVar4 = RectMatrix<double,_3U,_3U>::operator()(&local_80,1,2);
    *pdVar4 = dVar1 / dVar2;
    pdVar4 = Vector<double,_3U>::operator[](local_c0,1);
    dVar1 = *pdVar4;
    pdVar4 = RectMatrix<double,_3U,_3U>::operator()(&local_108,1,1);
    m2 = (SquareMatrix3<double> *)(dVar1 / *pdVar4);
    m1 = (SquareMatrix3<double> *)RectMatrix<double,_3U,_3U>::operator()(&local_80,2,0);
    (m1->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][0] = (double)m2;
    m = (RectMatrix<double,_3U,_3U> *)Vector<double,_3U>::operator[](local_c0,0);
    dVar1 = m->data_[0][0];
    v = (Vector<double,_3U> *)RectMatrix<double,_3U,_3U>::operator()(&local_108,0,0);
    this_00 = (StuntDouble *)(-dVar1 / v->data_[0]);
    pdVar4 = RectMatrix<double,_3U,_3U>::operator()(&local_80,2,1);
    *pdVar4 = (double)this_00;
    v_00 = (Vector<double,_3U> *)RectMatrix<double,_3U,_3U>::operator()(&local_80,2,2);
    v_00->data_[0] = 0.0;
    StuntDouble::getA(this_00);
    OpenMD::operator*(m1,m2);
    SquareMatrix3<double>::transpose(m1);
    OpenMD::operator*(m,v);
    Vector3<double>::operator=((Vector3<double> *)this_00,v_00);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x332625);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x332632);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x33263f);
    StuntDouble::getVel(this_00);
    OpenMD::operator+((Vector<double,_3U> *)this_00,v_00);
    Vector3<double>::operator=((Vector3<double> *)this_00,v_00);
    local_1 = 1;
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3326a1);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3326ae);
  }
  else {
    sVar3 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::size
                      ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x25));
    snprintf(painCave.errMsg,2000,
             "Index %d is an invalid index, the current rigid body contains %zu atoms.\n",
             (ulong)local_1c,sVar3);
    painCave.isFatal = 0;
    simError();
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool RigidBody::getAtomVel(Vector3d& vel, unsigned int index) {
    // velRot = $(A\cdot skew(I^{-1}j))^{T}refCoor$

    if (index < atoms_.size()) {
      Vector3d velRot;
      Mat3x3d skewMat;
      ;
      Vector3d ref = refCoords_[index];
      Vector3d ji  = getJ();
      Mat3x3d I    = getI();

      skewMat(0, 0) = 0;
      skewMat(0, 1) = ji[2] / I(2, 2);
      skewMat(0, 2) = -ji[1] / I(1, 1);

      skewMat(1, 0) = -ji[2] / I(2, 2);
      skewMat(1, 1) = 0;
      skewMat(1, 2) = ji[0] / I(0, 0);

      skewMat(2, 0) = ji[1] / I(1, 1);
      skewMat(2, 1) = -ji[0] / I(0, 0);
      skewMat(2, 2) = 0;

      velRot = (getA() * skewMat).transpose() * ref;

      vel = getVel() + velRot;
      return true;

    } else {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "Index %d is an invalid index, the current rigid body contains %zu "
          "atoms.\n",
          index, atoms_.size());
      painCave.isFatal = 0;
      simError();
      return false;
    }
  }